

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,false,false>
               (Vector *left,Vector *right,Vector *result,idx_t count,anon_class_8_1_6971b95b fun)

{
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *this;
  TemplatedValidityMask<unsigned_long> *other;
  ValidityMask *pVVar2;
  ValidityMask *in_RDX;
  ValidityMask *result_validity;
  string_t *result_data;
  string_t *rdata;
  string_t *ldata;
  ValidityMask *in_stack_000000d8;
  idx_t in_stack_000000e0;
  string_t *in_stack_000000e8;
  string_t *in_stack_000000f0;
  string_t *in_stack_000000f8;
  anon_class_8_1_6971b95b in_stack_00000100;
  Vector *in_stack_ffffffffffffff90;
  idx_t in_stack_ffffffffffffffb0;
  
  FlatVector::GetData<duckdb::string_t>((Vector *)0xe324c7);
  FlatVector::GetData<duckdb::string_t>((Vector *)0xe324d6);
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  this = (TemplatedValidityMask<unsigned_long> *)
         FlatVector::GetData<duckdb::string_t>((Vector *)0xe324f1);
  other = &FlatVector::Validity((Vector *)0xe32500)->super_TemplatedValidityMask<unsigned_long>;
  bVar1 = BinaryLambdaWrapper::AddsNulls();
  if (bVar1) {
    FlatVector::Validity((Vector *)0xe32527);
    TemplatedValidityMask<unsigned_long>::Copy(this,other,in_stack_ffffffffffffffb0);
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(other);
    if (bVar1) {
      FlatVector::Validity((Vector *)0xe3255d);
      TemplatedValidityMask<unsigned_long>::Copy(this,other,in_stack_ffffffffffffffb0);
    }
    else {
      pVVar2 = FlatVector::Validity((Vector *)0xe32585);
      duckdb::ValidityMask::Combine((ValidityMask *)other,(ulong)pVVar2);
    }
  }
  else {
    FlatVector::Validity((Vector *)0xe325ac);
    FlatVector::SetValidity(in_stack_ffffffffffffff90,in_RDX);
    pVVar2 = FlatVector::Validity((Vector *)0xe325cc);
    duckdb::ValidityMask::Combine((ValidityMask *)other,(ulong)pVVar2);
  }
  ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,false,false>
            (in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
             in_stack_000000d8,in_stack_00000100);
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}